

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

LIndex __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,JointActionObservationHistoryTree *jaoh)

{
  E *this_00;
  
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "GetJointActionObservationHistoryIndex(JointActionObservationHistoryTree* joh) seems like a dumb-ass function? I mean looping over exponentially many histories does not seem like a nice thing to do?"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

LIndex PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex(
        JointActionObservationHistoryTree* jaoh) const
{
    throw E("GetJointActionObservationHistoryIndex(JointActionObservationHistoryTree* joh) seems like a dumb-ass function? I mean looping over exponentially many histories does not seem like a nice thing to do?");
    for(Index i=0;i<_m_nrJointActionObservationHistories;i++)
    {
        if(_m_jointActionObservationHistoryTreeVector.at(i)==jaoh)
            return(i);
    }
    // we should not get here
    throw E("GetJointObservationHistoryIndex index not found");
    return(0);
}